

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O1

int ranges::detail::
    variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,0ul>>,ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,1ul>>>,true>::type,ranges::detail::variant_visitor<ranges::concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>::cursor<true>::advance_rev_fun,ranges::variant<void,void>>,ranges::detail::indexed_element_fn>
              (long n,long *self)

{
  int iVar1;
  long in_stack_00000010;
  long in_stack_00000018;
  
  if (n != 0) {
    iVar1 = variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,1ul>>>,true>::type,ranges::detail::variant_visitor<ranges::concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>::cursor<true>::advance_rev_fun,ranges::variant<void,void>>,ranges::detail::indexed_element_fn>
                      (n + -1);
    return iVar1;
  }
  *self = *self + in_stack_00000010 * 8;
  if (*(long *)(in_stack_00000018 + 8) != -1) {
    *(undefined8 *)(in_stack_00000018 + 8) = 0xffffffffffffffff;
  }
  *(undefined8 *)(in_stack_00000018 + 8) = 0;
  return 0;
}

Assistant:

constexpr int variant_visit_(std::size_t n, Data & self, Fun fun, Proj proj = {})
        {
            return 0 == n ? ((void)invoke(fun, invoke(proj, self.head)), 0)
                          : detail::variant_visit_(
                                n - 1, self.tail, detail::move(fun), detail::move(proj));
        }